

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QBGPlanner_TreeIncPruneBnB.cpp
# Opt level: O1

vector<AlphaVector,_std::allocator<AlphaVector>_> * __thiscall
QBGPlanner_TreeIncPruneBnB::GetGaoa(QBGPlanner_TreeIncPruneBnB *this,Index a,Index o,Index aPrime)

{
  multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>_>
  *pmVar1;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *pvVar2;
  E *this_00;
  
  pmVar1 = this->_m_Gaoa;
  pvVar2 = (pmVar1->
           super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>).
           super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
           .base_[(pmVar1->
                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                  ).
                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                  .origin_offset_ +
                  (ulong)a *
                  (pmVar1->
                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                  ).
                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                  .stride_list_.elems[0] +
                  (ulong)o *
                  (pmVar1->
                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                  ).
                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                  .stride_list_.elems[1] +
                  (ulong)aPrime *
                  (pmVar1->
                  super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL>
                  ).
                  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*,_3UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_**>
                  .stride_list_.elems[2]];
  if (pvVar2 == (vector<AlphaVector,_std::allocator<AlphaVector>_> *)0x0) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"QBGPlanner_TreeIncPruneBnB::GetGaoa set should have been computed");
  }
  else {
    if (aPrime != 0xffffffff) {
      return pvVar2;
    }
    this_00 = (E *)__cxa_allocate_exception(0x28);
    E::E(this_00,"QBGPlanner_TreeIncPruneBnB::GetGaoa the next time step action should be specified"
        );
  }
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

std::vector<AlphaVector>* QBGPlanner_TreeIncPruneBnB::GetGaoa(Index a, Index o, Index aPrime) const
{
    if((*_m_Gaoa)[a][o][aPrime]==0)
        throw(E("QBGPlanner_TreeIncPruneBnB::GetGaoa set should have been computed"));

    if(aPrime==UNSPECIFIED_ACTION)
        throw(E("QBGPlanner_TreeIncPruneBnB::GetGaoa the next time step action should be specified"));

    return((*_m_Gaoa)[a][o][aPrime]);
}